

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall Session::setParameters(Session *this,void *inParam,size_t inParamLen)

{
  void *pvVar1;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  
  if ((in_RSI != (void *)0x0) && (in_RDX != 0)) {
    if (*(long *)(in_RDI + 0x78) != 0) {
      free(*(void **)(in_RDI + 0x78));
      *(undefined8 *)(in_RDI + 0x80) = 0;
    }
    pvVar1 = malloc(in_RDX);
    *(void **)(in_RDI + 0x78) = pvVar1;
    if (*(long *)(in_RDI + 0x78) != 0) {
      memcpy(*(void **)(in_RDI + 0x78),in_RSI,in_RDX);
      *(size_t *)(in_RDI + 0x80) = in_RDX;
    }
  }
  return;
}

Assistant:

void Session::setParameters(void* inParam, size_t inParamLen)
{
	if (inParam == NULL || inParamLen == 0) return;

	if (param != NULL)
	{
		free(param);
		paramLen = 0;
	}

	param = malloc(inParamLen);
	if (param != NULL)
	{
		memcpy(param, inParam, inParamLen);
		paramLen = inParamLen;
	}
}